

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/mutex-test.c++:137:23)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_mutex_test_c__:137:23)>
             *this)

{
  MutexGuarded<unsigned_int> *this_00;
  Locked<unsigned_int> local_18;
  
  anon_unknown_0::delay();
  this_00 = (this->f).value;
  _::Mutex::lock(&this_00->mutex,EXCLUSIVE);
  local_18.ptr = &this_00->value;
  this_00->value = 0x141;
  local_18.mutex = &this_00->mutex;
  Locked<unsigned_int>::~Locked(&local_18);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }